

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_sse_blend_popcnt_unroll8(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  __m128i input3_1;
  __m128i input2_1;
  __m128i input1_1;
  __m128i input0_1;
  __m128i v3_1;
  __m128i v2_1;
  __m128i v1_1;
  __m128i v0_1;
  int i_1;
  __m128i input7;
  __m128i input6;
  __m128i input5;
  __m128i input4;
  __m128i input3;
  __m128i input2;
  __m128i input1;
  __m128i input0;
  __m128i v7;
  __m128i v6;
  __m128i v5;
  __m128i v4;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  size_t i;
  uint32_t n_cycles;
  __m128i *data_vectors;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined1 local_c88 [16];
  undefined1 local_c78 [16];
  undefined4 local_c3c;
  undefined1 local_c38 [16];
  undefined1 local_c28 [16];
  undefined1 local_c18 [16];
  undefined1 local_c08 [16];
  undefined4 local_bac;
  undefined1 local_ba8 [16];
  undefined1 local_b98 [16];
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined8 local_aa8;
  int j;
  int i_3;
  __m128i input1_2;
  __m128i input0_2;
  __m128i v1_2;
  __m128i v0_2;
  int i_2;
  
  uVar8 = in_ESI >> 3;
  for (local_aa8 = 0; local_aa8 + 8 <= (ulong)uVar8; local_aa8 = local_aa8 + 8) {
    pauVar9 = (undefined1 (*) [16])(in_RDI + local_aa8 * 0x10);
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + local_aa8 * 0x10);
    pauVar11 = (undefined1 (*) [16])(in_RDI + 0x20 + local_aa8 * 0x10);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 0x30 + local_aa8 * 0x10);
    pauVar10 = (undefined1 (*) [16])(in_RDI + 0x40 + local_aa8 * 0x10);
    pauVar3 = (undefined1 (*) [16])(in_RDI + 0x50 + local_aa8 * 0x10);
    pauVar4 = (undefined1 (*) [16])(in_RDI + 0x60 + local_aa8 * 0x10);
    pauVar5 = (undefined1 (*) [16])(in_RDI + 0x70 + local_aa8 * 0x10);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar6 = vpand_avx(*pauVar9,auVar6);
    auVar7 = vpsllw_avx(*pauVar1,ZEXT416(8));
    local_b38 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar6 = vpand_avx(*pauVar9,auVar6);
    auVar7 = vpsrlw_avx(*pauVar1,ZEXT416(8));
    local_b48 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar6 = vpand_avx(*pauVar11,auVar6);
    auVar7 = vpsllw_avx(*pauVar2,ZEXT416(8));
    local_b58 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar6 = vpand_avx(*pauVar11,auVar6);
    auVar7 = vpsrlw_avx(*pauVar2,ZEXT416(8));
    local_b68 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar6 = vpand_avx(*pauVar10,auVar6);
    auVar7 = vpsllw_avx(*pauVar3,ZEXT416(8));
    local_b78 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar6 = vpand_avx(*pauVar10,auVar6);
    auVar7 = vpsrlw_avx(*pauVar3,ZEXT416(8));
    local_b88 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar6 = vpand_avx(*pauVar4,auVar6);
    auVar7 = vpsllw_avx(*pauVar5,ZEXT416(8));
    local_b98 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar6 = vpand_avx(*pauVar4,auVar6);
    auVar7 = vpsrlw_avx(*pauVar5,ZEXT416(8));
    local_ba8 = vpor_avx(auVar6,auVar7);
    for (local_bac = 0; local_bac < 8; local_bac = local_bac + 1) {
      *(int *)(in_RDX + (long)(7 - local_bac) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_b38 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_b38 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_b38 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_b38 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_b38 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_b38 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_b38 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_b38 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_b38 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_b38 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_b38 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_b38 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_b38 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_b38 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_b38 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_b38[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_bac) * 4);
      *(int *)(in_RDX + (long)(0xf - local_bac) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_b48 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_b48 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_b48 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_b48 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_b48 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_b48 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_b48 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_b48 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_b48 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_b48 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_b48 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_b48 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_b48 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_b48 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_b48 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_b48[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_bac) * 4);
      *(int *)(in_RDX + (long)(7 - local_bac) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_b58 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_b58 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_b58 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_b58 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_b58 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_b58 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_b58 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_b58 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_b58 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_b58 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_b58 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_b58 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_b58 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_b58 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_b58 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_b58[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_bac) * 4);
      *(int *)(in_RDX + (long)(0xf - local_bac) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_b68 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_b68 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_b68 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_b68 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_b68 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_b68 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_b68 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_b68 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_b68 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_b68 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_b68 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_b68 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_b68 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_b68 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_b68 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_b68[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_bac) * 4);
      *(int *)(in_RDX + (long)(7 - local_bac) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_b78 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_b78 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_b78 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_b78 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_b78 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_b78 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_b78 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_b78 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_b78 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_b78 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_b78 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_b78 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_b78 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_b78 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_b78 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_b78[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_bac) * 4);
      *(int *)(in_RDX + (long)(0xf - local_bac) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_b88 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_b88 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_b88 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_b88 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_b88 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_b88 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_b88 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_b88 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_b88 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_b88 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_b88 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_b88 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_b88 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_b88 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_b88 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_b88[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_bac) * 4);
      *(int *)(in_RDX + (long)(7 - local_bac) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_b98 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_b98 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_b98 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_b98 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_b98 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_b98 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_b98 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_b98 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_b98 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_b98 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_b98 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_b98 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_b98 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_b98 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_b98 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_b98[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_bac) * 4);
      *(int *)(in_RDX + (long)(0xf - local_bac) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_ba8 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_ba8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_ba8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_ba8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_ba8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_ba8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_ba8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_ba8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_ba8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_ba8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_ba8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_ba8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_ba8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_ba8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_ba8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_ba8[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_bac) * 4);
      local_b38 = vpaddb_avx(local_b38,local_b38);
      local_b48 = vpaddb_avx(local_b48,local_b48);
      local_b58 = vpaddb_avx(local_b58,local_b58);
      local_b68 = vpaddb_avx(local_b68,local_b68);
      local_b78 = vpaddb_avx(local_b78,local_b78);
      local_b88 = vpaddb_avx(local_b88,local_b88);
      local_b98 = vpaddb_avx(local_b98,local_b98);
      local_ba8 = vpaddb_avx(local_ba8,local_ba8);
    }
  }
  for (; local_aa8 + 4 <= (ulong)uVar8; local_aa8 = local_aa8 + 4) {
    pauVar10 = (undefined1 (*) [16])(in_RDI + local_aa8 * 0x10);
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + local_aa8 * 0x10);
    pauVar11 = (undefined1 (*) [16])(in_RDI + 0x20 + local_aa8 * 0x10);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 0x30 + local_aa8 * 0x10);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar6 = vpand_avx(*pauVar10,auVar6);
    auVar7 = vpsllw_avx(*pauVar1,ZEXT416(8));
    local_c08 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar6 = vpand_avx(*pauVar10,auVar6);
    auVar7 = vpsrlw_avx(*pauVar1,ZEXT416(8));
    local_c18 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar6 = vpand_avx(*pauVar11,auVar6);
    auVar7 = vpsllw_avx(*pauVar2,ZEXT416(8));
    local_c28 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar6 = vpand_avx(*pauVar11,auVar6);
    auVar7 = vpsrlw_avx(*pauVar2,ZEXT416(8));
    local_c38 = vpor_avx(auVar6,auVar7);
    for (local_c3c = 0; local_c3c < 8; local_c3c = local_c3c + 1) {
      *(int *)(in_RDX + (long)(7 - local_c3c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_c08 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_c08 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_c08 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_c08 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_c08 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_c08 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_c08 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_c08 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_c08 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_c08 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_c08 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_c08 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_c08 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_c08 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_c08 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_c08[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_c3c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_c3c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_c18 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_c18 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_c18 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_c18 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_c18 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_c18 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_c18 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_c18 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_c18 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_c18 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_c18 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_c18 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_c18 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_c18 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_c18 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_c18[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_c3c) * 4);
      *(int *)(in_RDX + (long)(7 - local_c3c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_c28 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_c28 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_c28 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_c28 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_c28 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_c28 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_c28 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_c28 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_c28 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_c28 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_c28 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_c28 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_c28 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_c28 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_c28 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_c28[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_c3c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_c3c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_c38 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_c38 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_c38 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_c38 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_c38 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_c38 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_c38 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_c38 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_c38 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_c38 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_c38 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_c38 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_c38 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_c38 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_c38 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_c38[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_c3c) * 4);
      local_c08 = vpaddb_avx(local_c08,local_c08);
      local_c18 = vpaddb_avx(local_c18,local_c18);
      local_c28 = vpaddb_avx(local_c28,local_c28);
      local_c38 = vpaddb_avx(local_c38,local_c38);
    }
  }
  for (; local_aa8 + 2 <= (ulong)uVar8; local_aa8 = local_aa8 + 2) {
    pauVar11 = (undefined1 (*) [16])(in_RDI + local_aa8 * 0x10);
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + local_aa8 * 0x10);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar6 = vpand_avx(*pauVar11,auVar6);
    auVar7 = vpsllw_avx(*pauVar1,ZEXT416(8));
    local_c78 = vpor_avx(auVar6,auVar7);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar6 = vpand_avx(*pauVar11,auVar6);
    auVar7 = vpsrlw_avx(*pauVar1,ZEXT416(8));
    local_c88 = vpor_avx(auVar6,auVar7);
    for (local_c8c = 0; local_c8c < 8; local_c8c = local_c8c + 1) {
      *(int *)(in_RDX + (long)(7 - local_c8c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_c78 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_c78 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_c78 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_c78 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_c78 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_c78 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_c78 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_c78 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_c78 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_c78 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_c78 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_c78 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_c78 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_c78 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_c78 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_c78[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_c8c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_c8c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_c88 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_c88 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_c88 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_c88 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_c88 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_c88 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_c88 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_c88 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_c88 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_c88 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_c88 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_c88 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_c88 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_c88 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_c88 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_c88[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_c8c) * 4);
      local_c78 = vpaddb_avx(local_c78,local_c78);
      local_c88 = vpaddb_avx(local_c88,local_c88);
    }
  }
  for (local_aa8 = local_aa8 << 3; local_aa8 < in_ESI; local_aa8 = local_aa8 + 1) {
    for (local_c90 = 0; local_c90 < 0x10; local_c90 = local_c90 + 1) {
      *(int *)(in_RDX + (long)local_c90 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_aa8 * 2) & 1 << ((byte)local_c90 & 0x1f)) >>
           ((byte)local_c90 & 0x1f)) + *(int *)(in_RDX + (long)local_c90 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll8(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 8 <= n_cycles; i += 8) {
#define L(p) __m128i v##p = _mm_loadu_si128(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3) U(4,5) U(6,7)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3) A(4,5) A(6, 7)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3) P(4,5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    return 0;
}